

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
jessilib::
split_once<std::__cxx11::wstring,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,wchar_t>
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          begin,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                end,wchar_t in_delim)

{
  bool bVar1;
  reference pwVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_108;
  wchar_t *local_e8;
  wchar_t *local_e0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  wchar_t *local_a8;
  wchar_t *local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_78;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  itr;
  undefined1 local_68 [8];
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  result;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_20;
  wchar_t in_delim_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin_local;
  
  result.second.field_2._M_local_buf[3] = (wchar_t)end._M_current;
  _Stack_20._M_current = begin._M_current;
  end_local._M_current = (wchar_t *)this;
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
            ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              *)local_68);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><wchar_t_const*,std::__cxx11::wstring>
                 (&end_local,&stack0xffffffffffffffe0);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            *)local_68);
  }
  else {
    local_78._M_current = end_local._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        (&local_78,&stack0xffffffffffffffe0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pwVar2 = __gnu_cxx::
               __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               ::operator*(&local_78);
      if (*pwVar2 == result.second.field_2._M_local_buf[3]) {
        local_a0 = end_local._M_current;
        local_a8 = local_78._M_current;
        make_split_member<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
                  (&local_98,end_local,local_78);
        std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
        operator=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  local_68,&local_98);
        std::__cxx11::wstring::~wstring((wstring *)&local_98);
        local_e0 = (wchar_t *)
                   __gnu_cxx::
                   __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   ::operator+(&local_78,1);
        local_e8 = _Stack_20._M_current;
        make_split_member<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
                  (&local_d8,
                   (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    )local_e0,_Stack_20);
        std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
        operator=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  ((long)&result.first.field_2 + 8),&local_d8);
        std::__cxx11::wstring::~wstring((wstring *)&local_d8);
        std::
        pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::pair(__return_storage_ptr__,
               (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)local_68);
        goto LAB_004c5272;
      }
      __gnu_cxx::
      __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator++(&local_78);
    }
    make_split_member<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
              (&local_108,end_local,_Stack_20);
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    operator=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_68
              ,&local_108);
    std::__cxx11::wstring::~wstring((wstring *)&local_108);
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            *)local_68);
  }
LAB_004c5272:
  itr._M_current._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~pair((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *)local_68);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}